

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O2

Node * __thiscall M_tree::delete_one_leaf(M_tree *this,Node *tail)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node **ppNVar4;
  
  do {
    pNVar1 = tail->parent;
    if (pNVar1 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar2 = pNVar1->left;
    pNVar3 = pNVar1->right;
    if (tail == pNVar2) {
      ppNVar4 = &pNVar1->left;
      if ((pNVar3 != (Node *)0x0) &&
         ((ppNVar4 = &pNVar1->right, pNVar2 != (Node *)0x0 || (tail != pNVar3)))) {
        pNVar1->left = (Node *)0x0;
LAB_0010483a:
        if (tail == pNVar3) {
          pNVar1->right = (Node *)0x0;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tail->key);
        operator_delete(tail,0x50);
        return pNVar1;
      }
    }
    else if ((pNVar2 != (Node *)0x0) || (ppNVar4 = &pNVar1->right, tail != pNVar3))
    goto LAB_0010483a;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tail->key);
    operator_delete(tail,0x50);
    *ppNVar4 = (Node *)0x0;
    tail = pNVar1;
  } while( true );
}

Assistant:

Node *M_tree::delete_one_leaf(Node *tail) {
    Node* up = tail->parent;
    while(up!=NULL){
        if(tail == up->left && up->right == NULL){
            delete(tail);
            tail = up;
            up->left = NULL;
        }
        else if(tail == up->right && up->left == NULL){
            delete(tail);
            tail = up;
            up->right = NULL;
        }
        else{
            if(tail == up->left){
                up->left = NULL;
            }
            if(tail == up->right){
                up->right = NULL;
            }
            delete(tail);
            return up;
        }
        up = tail->parent;
    }
    return NULL;
}